

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlIsBaseChar(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined4 local_30;
  int local_2c;
  uint ch;
  int c_retval;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"i:xmlIsBaseChar",&local_30);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    local_2c = xmlIsBaseChar(local_30);
    self_local = libxml_intWrap(local_2c);
  }
  return self_local;
}

Assistant:

XML_POP_WARNINGS

PyObject *
libxml_xmlIsBaseChar(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    PyObject *py_retval;
    int c_retval;
    unsigned int ch;

    if (!PyArg_ParseTuple(args, (char *)"i:xmlIsBaseChar", &ch))
        return(NULL);

    c_retval = xmlIsBaseChar(ch);
    py_retval = libxml_intWrap((int) c_retval);
    return(py_retval);
}